

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

void slab_unmap(slab_arena *arena,void *ptr)

{
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  void *ptr_local;
  slab_arena *arena_local;
  
  if (ptr != (void *)0x0) {
    lf_lifo_push(&arena->cache,ptr);
    lf_lifo(ptr);
  }
  return;
}

Assistant:

void
slab_unmap(struct slab_arena *arena, void *ptr)
{
	if (ptr == NULL)
		return;

	lf_lifo_push(&arena->cache, ptr);
	VALGRIND_MAKE_MEM_NOACCESS(ptr, arena->slab_size);
	VALGRIND_MAKE_MEM_DEFINED(lf_lifo(ptr), sizeof(struct lf_lifo));
}